

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O0

void Map_SuperTableResize(Map_HashTable_t *p)

{
  uint uVar1;
  Map_HashEntry_t **__s;
  uint uVar2;
  Map_HashEntry_t *local_48;
  Map_HashEntry_t *local_40;
  int local_34;
  uint Key;
  int i;
  int Counter;
  int nBinsNew;
  Map_HashEntry_t *pEnt2;
  Map_HashEntry_t *pEnt;
  Map_HashEntry_t **pBinsNew;
  Map_HashTable_t *p_local;
  
  uVar1 = Abc_PrimeCudd(p->nBins << 1);
  __s = (Map_HashEntry_t **)malloc((long)(int)uVar1 << 3);
  memset(__s,0,(long)(int)uVar1 << 3);
  Key = 0;
  for (local_34 = 0; local_34 < p->nBins; local_34 = local_34 + 1) {
    pEnt2 = p->pBins[local_34];
    if (pEnt2 == (Map_HashEntry_t *)0x0) {
      local_40 = (Map_HashEntry_t *)0x0;
    }
    else {
      local_40 = pEnt2->pNext;
    }
    _Counter = local_40;
    while (pEnt2 != (Map_HashEntry_t *)0x0) {
      uVar2 = (pEnt2->uTruth[0] + pEnt2->uTruth[1] * 0x7d3) % uVar1;
      pEnt2->pNext = __s[uVar2];
      __s[uVar2] = pEnt2;
      Key = Key + 1;
      pEnt2 = _Counter;
      if (_Counter == (Map_HashEntry_t *)0x0) {
        local_48 = (Map_HashEntry_t *)0x0;
      }
      else {
        local_48 = _Counter->pNext;
      }
      _Counter = local_48;
    }
  }
  if (Key != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTable.c"
                  ,0xff,"void Map_SuperTableResize(Map_HashTable_t *)");
  }
  if (p->pBins != (Map_HashEntry_t **)0x0) {
    free(p->pBins);
    p->pBins = (Map_HashEntry_t **)0x0;
  }
  p->pBins = __s;
  p->nBins = uVar1;
  return;
}

Assistant:

void Map_SuperTableResize( Map_HashTable_t * p )
{
    Map_HashEntry_t ** pBinsNew;
    Map_HashEntry_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    unsigned Key;
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Map_HashEntry_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Map_HashEntry_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i], pEnt2 = pEnt? pEnt->pNext: NULL; pEnt; 
              pEnt = pEnt2, pEnt2 = pEnt? pEnt->pNext: NULL )
        {
            Key = MAP_TABLE_HASH( pEnt->uTruth[0], pEnt->uTruth[1], nBinsNew );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}